

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  __m256i alVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i alVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  short sVar29;
  short sVar30;
  int iVar31;
  int iVar32;
  parasail_result_t *ppVar33;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  ulong uVar34;
  long lVar35;
  long lVar36;
  short sVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  uint uVar45;
  __m256i *palVar46;
  long lVar47;
  int iVar48;
  short sVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  ulong uVar52;
  long lVar53;
  ulong size;
  long lVar54;
  long lVar55;
  uint uVar56;
  undefined2 uVar57;
  undefined2 uVar58;
  undefined2 uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar66 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  long local_330;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 auVar80 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar45 = profile->s1Len;
        if ((int)uVar45 < 1) {
          parasail_nw_stats_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_avx2_256_16_cold_4();
        }
        else {
          uVar52 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_avx2_256_16_cold_1();
          }
          else {
            uVar56 = uVar45 - 1;
            size = (ulong)uVar45 + 0xf >> 4;
            uVar10 = (ulong)uVar56 % size;
            pvVar8 = (profile->profile16).matches;
            pvVar9 = (profile->profile16).similar;
            iVar44 = -open;
            iVar48 = ppVar7->min;
            iVar32 = -iVar48;
            if (iVar48 != iVar44 && SBORROW4(iVar48,iVar44) == iVar48 + open < 0) {
              iVar32 = open;
            }
            sVar29 = 0x7ffe - (short)ppVar7->max;
            ppVar33 = parasail_result_new_table3((uint)((ulong)uVar45 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar33 != (parasail_result_t *)0x0) {
              iVar48 = (int)(uVar56 / size);
              ppVar33->flag = ppVar33->flag | 0x10230401;
              b = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              b_05 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              ptr_04 = parasail_memalign___m256i(0x20,size);
              ptr_05 = parasail_memalign___m256i(0x20,size);
              ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              auVar68._8_8_ = 0;
              auVar68._0_8_ = b;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = b_00;
              auVar68 = vpunpcklqdq_avx(auVar68,auVar72);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_01;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = b_02;
              auVar72 = vpunpcklqdq_avx(auVar60,auVar66);
              auVar60 = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar68;
              auVar66 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = ptr;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = b_03;
              auVar68 = vpunpcklqdq_avx(auVar67,auVar73);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = b_04;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = b_05;
              auVar72 = vpunpcklqdq_avx(auVar74,auVar78);
              auVar68 = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar68;
              auVar72 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72;
              auVar61._0_8_ = -(ulong)(auVar60._0_8_ == 0);
              auVar61._8_8_ = -(ulong)(auVar60._8_8_ == 0);
              auVar61._16_8_ = -(ulong)(auVar66._0_8_ == 0);
              auVar61._24_8_ = -(ulong)(auVar66._8_8_ == 0);
              auVar69._0_8_ = -(ulong)(auVar68._0_8_ == 0);
              auVar69._8_8_ = -(ulong)(auVar68._8_8_ == 0);
              auVar69._16_8_ = -(ulong)(auVar72._0_8_ == 0);
              auVar69._24_8_ = -(ulong)(auVar72._8_8_ == 0);
              auVar61 = vpackssdw_avx2(auVar61,auVar69);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int16_t *)0x0) &&
                  ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar61 >> 0x7f,0) == '\0') &&
                     (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar61 >> 0xbf,0) == '\0') &&
                   (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar61[0x1f])) {
                iVar31 = s2Len + -1;
                uVar57 = (undefined2)open;
                uVar58 = (undefined2)gap;
                uVar59 = (undefined2)(iVar32 - 0x7fffU);
                auVar62._0_2_ = (undefined2)size;
                auVar62._2_2_ = auVar62._0_2_;
                auVar62._4_2_ = auVar62._0_2_;
                auVar62._6_2_ = auVar62._0_2_;
                auVar62._8_2_ = auVar62._0_2_;
                auVar62._10_2_ = auVar62._0_2_;
                auVar62._12_2_ = auVar62._0_2_;
                auVar62._14_2_ = auVar62._0_2_;
                auVar62._16_2_ = auVar62._0_2_;
                auVar62._18_2_ = auVar62._0_2_;
                auVar62._20_2_ = auVar62._0_2_;
                auVar62._22_2_ = auVar62._0_2_;
                auVar62._24_2_ = auVar62._0_2_;
                auVar62._26_2_ = auVar62._0_2_;
                auVar62._28_2_ = auVar62._0_2_;
                auVar62._30_2_ = auVar62._0_2_;
                auVar82 = vperm2i128_avx2(auVar62,auVar62,0x28);
                auVar63._0_2_ = (undefined2)-((int)size * gap);
                auVar63._2_2_ = auVar63._0_2_;
                auVar63._4_2_ = auVar63._0_2_;
                auVar63._6_2_ = auVar63._0_2_;
                auVar63._8_2_ = auVar63._0_2_;
                auVar63._10_2_ = auVar63._0_2_;
                auVar63._12_2_ = auVar63._0_2_;
                auVar63._14_2_ = auVar63._0_2_;
                auVar63._16_2_ = auVar63._0_2_;
                auVar63._18_2_ = auVar63._0_2_;
                auVar63._20_2_ = auVar63._0_2_;
                auVar63._22_2_ = auVar63._0_2_;
                auVar63._24_2_ = auVar63._0_2_;
                auVar63._26_2_ = auVar63._0_2_;
                auVar63._28_2_ = auVar63._0_2_;
                auVar63._30_2_ = auVar63._0_2_;
                auVar61 = vpand_avx2(auVar63,_DAT_00908de0);
                auVar63 = ZEXT432(iVar32 - 0x7fffU & 0xffff);
                auVar61 = vpaddsw_avx2(auVar63,auVar61);
                alVar16[1] = (longlong)b_04;
                alVar16[0] = (longlong)b_01;
                alVar16[2] = (longlong)b_03;
                alVar16[3] = (longlong)ptr;
                parasail_memset___m256i(b_03,alVar16,size);
                alVar2[1] = (longlong)b_04;
                alVar2[0] = (longlong)b_01;
                alVar2[2] = (longlong)b_03;
                alVar2[3] = (longlong)ptr;
                parasail_memset___m256i(b_04,alVar2,size);
                alVar3[1] = (longlong)b_04;
                alVar3[0] = (longlong)b_01;
                alVar3[2] = (longlong)b_03;
                alVar3[3] = (longlong)ptr;
                parasail_memset___m256i(b_05,alVar3,size);
                alVar5[1] = (longlong)b_04;
                alVar5[0] = (longlong)b_01;
                alVar5[2] = (longlong)b_03;
                alVar5[3] = (longlong)ptr;
                parasail_memset___m256i(b,alVar5,size);
                c[1] = (longlong)b_04;
                c[0] = (longlong)b_01;
                c[2] = (longlong)b_03;
                c[3] = (longlong)ptr;
                parasail_memset___m256i(b_00,c,size);
                c_00[1] = (longlong)b_04;
                c_00[0] = (longlong)b_01;
                c_00[2] = (longlong)b_03;
                c_00[3] = (longlong)ptr;
                parasail_memset___m256i(b_01,c_00,size);
                c_01[1] = (longlong)b_04;
                c_01[0] = (longlong)b_01;
                c_01[2] = (longlong)b_03;
                c_01[3] = (longlong)ptr;
                parasail_memset___m256i(b_02,c_01,size);
                auVar14._2_2_ = uVar58;
                auVar14._0_2_ = uVar58;
                auVar14._4_2_ = uVar58;
                auVar14._6_2_ = uVar58;
                auVar14._8_2_ = uVar58;
                auVar14._10_2_ = uVar58;
                auVar14._12_2_ = uVar58;
                auVar14._14_2_ = uVar58;
                auVar14._16_2_ = uVar58;
                auVar14._18_2_ = uVar58;
                auVar14._20_2_ = uVar58;
                auVar14._22_2_ = uVar58;
                auVar14._24_2_ = uVar58;
                auVar14._26_2_ = uVar58;
                auVar14._28_2_ = uVar58;
                auVar14._30_2_ = uVar58;
                auVar15._2_2_ = uVar57;
                auVar15._0_2_ = uVar57;
                auVar15._4_2_ = uVar57;
                auVar15._6_2_ = uVar57;
                auVar15._8_2_ = uVar57;
                auVar15._10_2_ = uVar57;
                auVar15._12_2_ = uVar57;
                auVar15._14_2_ = uVar57;
                auVar15._16_2_ = uVar57;
                auVar15._18_2_ = uVar57;
                auVar15._20_2_ = uVar57;
                auVar15._22_2_ = uVar57;
                auVar15._24_2_ = uVar57;
                auVar15._26_2_ = uVar57;
                auVar15._28_2_ = uVar57;
                auVar15._30_2_ = uVar57;
                auVar15 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar15);
                uVar34 = (ulong)((int)size - 1);
                lVar38 = uVar34 << 5;
                auVar70._8_2_ = 1;
                auVar70._0_8_ = 0x1000100010001;
                auVar70._10_2_ = 1;
                auVar70._12_2_ = 1;
                auVar70._14_2_ = 1;
                auVar70._16_2_ = 1;
                auVar70._18_2_ = 1;
                auVar70._20_2_ = 1;
                auVar70._22_2_ = 1;
                auVar70._24_2_ = 1;
                auVar70._26_2_ = 1;
                auVar70._28_2_ = 1;
                auVar70._30_2_ = 1;
                uVar39 = size;
                auVar69 = auVar70;
                do {
                  *(undefined1 (*) [32])((long)*ptr_04 + lVar38) = auVar15;
                  *(undefined1 (*) [32])((long)*ptr_05 + lVar38) = auVar69;
                  auVar15 = vpsubsw_avx2(auVar15,auVar14);
                  auVar69 = vpaddsw_avx2(auVar69,auVar70);
                  lVar38 = lVar38 + -0x20;
                  iVar32 = (int)uVar39;
                  uVar45 = iVar32 - 1;
                  uVar39 = (ulong)uVar45;
                } while (uVar45 != 0 && 0 < iVar32);
                auVar64._4_4_ = gap;
                auVar64._0_4_ = gap;
                auVar64._8_4_ = gap;
                auVar64._12_4_ = gap;
                auVar64._16_4_ = gap;
                auVar64._20_4_ = gap;
                auVar64._24_4_ = gap;
                auVar64._28_4_ = gap;
                auVar71._4_4_ = iVar44;
                auVar71._0_4_ = iVar44;
                auVar71._8_4_ = iVar44;
                auVar71._12_4_ = iVar44;
                auVar71._16_4_ = iVar44;
                auVar71._20_4_ = iVar44;
                auVar71._24_4_ = iVar44;
                auVar71._28_4_ = iVar44;
                auVar75._8_8_ = size;
                auVar75._0_8_ = size;
                auVar75._16_8_ = size;
                auVar75._24_8_ = size;
                auVar15 = vpmuldq_avx2(auVar75,_DAT_00908e00);
                auVar14 = vpmuldq_avx2(auVar75,_DAT_00908e20);
                auVar70 = vpmuldq_avx2(auVar75,_DAT_00908c60);
                auVar75 = vpmuldq_avx2(auVar75,_DAT_00908b60);
                uVar39 = 0;
                auVar69 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
                auVar76._8_4_ = 0xffff8000;
                auVar76._0_8_ = 0xffff8000ffff8000;
                auVar76._12_4_ = 0xffff8000;
                auVar76._16_4_ = 0xffff8000;
                auVar76._20_4_ = 0xffff8000;
                auVar76._24_4_ = 0xffff8000;
                auVar76._28_4_ = 0xffff8000;
                palVar46 = ptr;
                do {
                  auVar85._8_8_ = uVar39;
                  auVar85._0_8_ = uVar39;
                  auVar85._16_8_ = uVar39;
                  auVar85._24_8_ = uVar39;
                  auVar80 = vpaddq_avx2(auVar85,auVar15);
                  auVar89 = vpaddq_avx2(auVar85,auVar14);
                  auVar86 = vpaddq_avx2(auVar85,auVar70);
                  auVar85 = vpaddq_avx2(auVar85,auVar75);
                  auVar85 = vpermd_avx2(auVar69,auVar85);
                  auVar81 = vpermd_avx2(auVar69,auVar86);
                  auVar86._0_16_ = ZEXT116(0) * auVar81._0_16_ + ZEXT116(1) * auVar85._0_16_;
                  auVar86._16_16_ = ZEXT116(0) * auVar85._16_16_ + ZEXT116(1) * auVar81._0_16_;
                  auVar89 = vpermd_avx2(auVar69,auVar89);
                  auVar80 = vpermd_avx2(auVar69,auVar80);
                  auVar68 = auVar89._0_16_;
                  auVar88._0_16_ = ZEXT116(0) * auVar80._0_16_ + ZEXT116(1) * auVar68;
                  auVar88._16_16_ = ZEXT116(0) * auVar89._16_16_ + ZEXT116(1) * auVar80._0_16_;
                  auVar80 = vpmulld_avx2(auVar64,auVar88);
                  auVar89 = vpmulld_avx2(auVar64,auVar86);
                  auVar86 = vpsubd_avx2(auVar71,auVar89);
                  auVar80 = vpsubd_avx2(auVar71,auVar80);
                  auVar89 = vpmaxsd_avx2(auVar80,auVar76);
                  auVar80 = vpmaxsd_avx2(auVar86,auVar76);
                  auVar80 = vpblendw_avx2(auVar80,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                  auVar89 = vpblendw_avx2(auVar89,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                  auVar80 = vpackusdw_avx2(auVar80,auVar89);
                  alVar16 = (__m256i)vpermq_avx2(auVar80,0xd8);
                  *palVar46 = alVar16;
                  uVar39 = uVar39 + 1;
                  palVar46 = palVar46 + 1;
                } while (size != uVar39);
                *ptr_06 = 0;
                lVar38 = uVar52 - 1;
                auVar79._8_8_ = lVar38;
                auVar79._0_8_ = lVar38;
                auVar80._16_8_ = lVar38;
                auVar80._0_16_ = auVar79;
                auVar80._24_8_ = lVar38;
                auVar15 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
                auVar69 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
                uVar39 = 0;
                auVar87._8_8_ = 0x8000000000000000;
                auVar87._0_8_ = 0x8000000000000000;
                auVar68 = vpcmpeqd_avx(auVar68,auVar68);
                auVar14 = vpcmpeqd_avx2(auVar81,auVar81);
                auVar89._8_8_ = 0x8000000000000000;
                auVar89._0_8_ = 0x8000000000000000;
                auVar89._16_8_ = 0x8000000000000000;
                auVar89._24_8_ = 0x8000000000000000;
                auVar70 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
                do {
                  auVar81._8_8_ = uVar39;
                  auVar81._0_8_ = uVar39;
                  auVar81._16_8_ = uVar39;
                  auVar81._24_8_ = uVar39;
                  auVar85 = vpor_avx2(auVar81,_DAT_00908b60);
                  auVar72 = vpcmpgtq_avx(auVar85._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar72 = vpackssdw_avx(auVar72 ^ auVar68,auVar72 ^ auVar68);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  auVar75 = vpaddd_avx2(auVar14,auVar69);
                  auVar86 = vpaddd_avx2(auVar14,auVar15);
                  auVar86 = vpmulld_avx2(auVar86,auVar64);
                  auVar75 = vpmulld_avx2(auVar75,auVar64);
                  auVar75 = vpsubd_avx2(auVar71,auVar75);
                  auVar86 = vpsubd_avx2(auVar71,auVar86);
                  auVar86 = vpmaxsd_avx2(auVar86,auVar76);
                  auVar75 = vpmaxsd_avx2(auVar75,auVar76);
                  auVar75 = vpblendw_avx2(auVar75,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                  auVar86 = vpblendw_avx2(auVar86,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
                  auVar75 = vpackusdw_avx2(auVar75,auVar86);
                  auVar75 = vpermq_avx2(auVar75,0xd8);
                  auVar60 = auVar75._0_16_;
                  if ((auVar72 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,0);
                  }
                  auVar72 = vpcmpgtq_avx(auVar85._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar72 = vpackssdw_avx(auVar72 ^ auVar68,auVar72 ^ auVar68);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,1);
                  }
                  auVar88 = auVar89 ^ auVar80;
                  auVar86 = vpcmpgtq_avx2(auVar85 ^ auVar89,auVar88);
                  auVar85 = vpshuflw_avx2(auVar86,0xe8);
                  auVar85 = vpermd_avx2(auVar70,auVar85 ^ auVar14);
                  auVar72 = vpackssdw_avx(auVar85._0_16_,auVar85._0_16_);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,2);
                  }
                  auVar72 = vpackssdw_avx(auVar86._16_16_,auVar86._16_16_);
                  auVar72 = vpackssdw_avx(auVar72 ^ auVar68,auVar72 ^ auVar68);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,3);
                  }
                  auVar85 = vpor_avx2(auVar81,_DAT_00908c60);
                  auVar72 = vpcmpgtq_avx(auVar85._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar86 = vpermq_avx2(ZEXT1632(auVar68 ^ auVar72),0x55);
                  auVar86 = vpackssdw_avx2(auVar86,auVar64);
                  auVar72 = vpacksswb_avx(auVar86._16_16_,auVar86._16_16_);
                  if ((auVar72 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,4);
                  }
                  auVar72 = vpcmpgtq_avx(auVar85._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpshufhw_avx(auVar72,0x84);
                  auVar86 = vpermq_avx2(ZEXT1632(auVar68 ^ auVar72),0x55);
                  auVar86 = vpackssdw_avx2(auVar86,auVar64);
                  auVar72 = vpacksswb_avx(auVar86._16_16_,auVar86._16_16_);
                  if ((auVar72 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,5);
                  }
                  auVar85 = vpcmpgtq_avx2(auVar85 ^ auVar89,auVar88);
                  auVar86 = vpackssdw_avx2(auVar64,auVar85);
                  auVar86 = vpackssdw_avx2(auVar14 ^ auVar86,auVar64);
                  auVar72 = vpacksswb_avx(auVar86._16_16_,auVar86._16_16_);
                  if ((auVar72 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,6);
                  }
                  auVar86 = vpackssdw_avx2(auVar64,auVar85);
                  auVar86 = vpackssdw_avx2(auVar14 ^ auVar86,auVar64);
                  auVar72 = vpacksswb_avx(auVar86._16_16_,auVar86._16_16_);
                  if ((auVar72 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,7);
                  }
                  auVar86 = vpor_avx2(auVar81,_DAT_00908e20);
                  auVar72 = vpcmpgtq_avx(auVar86._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar72 = vpackssdw_avx(auVar68 ^ auVar72,auVar68 ^ auVar72);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  auVar60 = auVar75._16_16_;
                  if ((auVar72 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,0);
                  }
                  auVar72 = vpcmpgtq_avx(auVar86._0_16_ ^ auVar87,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar72 = vpackssdw_avx(auVar68 ^ auVar72,auVar68 ^ auVar72);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,1);
                  }
                  auVar75 = vpcmpgtq_avx2(auVar86 ^ auVar89,auVar88);
                  auVar86 = vpshuflw_avx2(auVar75,0xe8);
                  auVar86 = vpermd_avx2(auVar70,auVar14 ^ auVar86);
                  auVar72 = vpackssdw_avx(auVar86._0_16_,auVar86._0_16_);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,2);
                  }
                  auVar72 = vpackssdw_avx(auVar75._16_16_,auVar75._16_16_);
                  auVar72 = vpackssdw_avx(auVar68 ^ auVar72,auVar68 ^ auVar72);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  if ((auVar72 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,3);
                  }
                  auVar86 = vpor_avx2(auVar81,_DAT_00908e00);
                  auVar72 = vpcmpgtq_avx(auVar87 ^ auVar86._0_16_,auVar87 ^ auVar79);
                  auVar72 = vpackssdw_avx(auVar72,auVar72);
                  auVar75 = vpermq_avx2(ZEXT1632(auVar68 ^ auVar72),0x55);
                  auVar75 = vpackssdw_avx2(auVar64,auVar75);
                  auVar72 = vpacksswb_avx(auVar75._16_16_,auVar75._16_16_);
                  if ((auVar72 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,4);
                  }
                  auVar72 = vpcmpgtq_avx(auVar87 ^ auVar86._0_16_,auVar87 ^ auVar79);
                  auVar72 = vpshufhw_avx(auVar72,0x84);
                  auVar75 = vpermq_avx2(ZEXT1632(auVar68 ^ auVar72),0x55);
                  auVar75 = vpackssdw_avx2(auVar64,auVar75);
                  auVar72 = vpacksswb_avx(auVar75._16_16_,auVar75._16_16_);
                  if ((auVar72 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,5);
                  }
                  auVar86 = vpcmpgtq_avx2(auVar89 ^ auVar86,auVar88);
                  auVar75 = vpackssdw_avx2(auVar64,auVar86);
                  auVar75 = vpackssdw_avx2(auVar64,auVar14 ^ auVar75);
                  auVar72 = vpacksswb_avx(auVar75._16_16_,auVar75._16_16_);
                  if ((auVar72 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,6);
                  }
                  auVar75 = vpackssdw_avx2(auVar64,auVar86);
                  auVar75 = vpackssdw_avx2(auVar64,auVar14 ^ auVar75);
                  auVar72 = vpacksswb_avx(auVar75._16_16_,auVar75._16_16_);
                  if ((auVar72 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    vpextrw_avx(auVar60,7);
                  }
                  uVar39 = uVar39 + 0x10;
                  auVar11._8_4_ = 0x10;
                  auVar11._0_8_ = 0x1000000010;
                  auVar11._12_4_ = 0x10;
                  auVar11._16_4_ = 0x10;
                  auVar11._20_4_ = 0x10;
                  auVar11._24_4_ = 0x10;
                  auVar11._28_4_ = 0x10;
                  auVar69 = vpaddd_avx2(auVar69,auVar11);
                  auVar15 = vpaddd_avx2(auVar15,auVar11);
                } while ((s2Len + 0xfU & 0xfffffff0) != uVar39);
                auVar69 = vpalignr_avx2(auVar62,auVar82,0xe);
                lVar54 = size * uVar52;
                lVar38 = lVar54 * 4;
                lVar1 = lVar54 * 8;
                lVar22 = lVar54 * 0x1c;
                lVar40 = lVar54 * 0x2c;
                lVar41 = lVar54 * 0x34;
                lVar42 = lVar54 * 0x38;
                lVar43 = lVar54 * 0x3c;
                lVar55 = lVar54 * 0x10;
                lVar35 = lVar54 * 0x20;
                local_1d8._2_2_ = uVar59;
                local_1d8._0_2_ = uVar59;
                local_1d8._4_2_ = uVar59;
                local_1d8._6_2_ = uVar59;
                local_1d8._8_2_ = uVar59;
                local_1d8._10_2_ = uVar59;
                local_1d8._12_2_ = uVar59;
                local_1d8._14_2_ = uVar59;
                local_1d8._16_2_ = uVar59;
                local_1d8._18_2_ = uVar59;
                local_1d8._20_2_ = uVar59;
                local_1d8._22_2_ = uVar59;
                local_1d8._24_2_ = uVar59;
                local_1d8._26_2_ = uVar59;
                local_1d8._28_2_ = uVar59;
                local_1d8._30_2_ = uVar59;
                auVar65 = ZEXT3264(local_1d8);
                local_1b8._2_2_ = sVar29;
                local_1b8._0_2_ = sVar29;
                local_1b8._4_2_ = sVar29;
                local_1b8._6_2_ = sVar29;
                local_1b8._10_2_ = sVar29;
                local_1b8._8_2_ = sVar29;
                local_1b8._12_2_ = sVar29;
                local_1b8._14_2_ = sVar29;
                local_1b8._18_2_ = sVar29;
                local_1b8._16_2_ = sVar29;
                local_1b8._20_2_ = sVar29;
                local_1b8._22_2_ = sVar29;
                local_1b8._26_2_ = sVar29;
                local_1b8._24_2_ = sVar29;
                local_1b8._28_2_ = sVar29;
                local_1b8._30_2_ = sVar29;
                lVar17 = lVar54 * 0xc;
                lVar18 = lVar54 * 0x14;
                lVar19 = lVar54 * 0x18;
                lVar20 = lVar54 * 0x24;
                lVar21 = lVar54 * 0x28;
                lVar54 = lVar54 * 0x30;
                local_330 = 0;
                uVar39 = 0;
                do {
                  alVar16 = b_03[uVar34];
                  alVar2 = b_04[uVar34];
                  alVar3 = b_05[uVar34];
                  auVar68 = SUB3216(ptr[uVar34],0);
                  auVar82._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar65._0_16_;
                  auVar82._16_16_ = ZEXT116(0) * auVar65._16_16_ + ZEXT116(1) * auVar68;
                  auVar15 = vpalignr_avx2((undefined1  [32])ptr[uVar34],auVar82,0xe);
                  auVar82 = vperm2i128_avx2((undefined1  [32])alVar16,(undefined1  [32])alVar16,0x28
                                           );
                  auVar62 = vpalignr_avx2((undefined1  [32])alVar16,auVar82,0xe);
                  auVar82 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar82 = vpalignr_avx2((undefined1  [32])alVar2,auVar82,0xe);
                  auVar14 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar14 = vpalignr_avx2((undefined1  [32])alVar3,auVar14,0xe);
                  auVar68 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar39],0);
                  auVar15 = vpblendd_avx2(auVar15,ZEXT1632(auVar68),0xf);
                  lVar53 = size * (long)ppVar7->mapper[(byte)s2[uVar39]] * 0x20;
                  auVar13._2_2_ = uVar59;
                  auVar13._0_2_ = uVar59;
                  auVar13._4_2_ = uVar59;
                  auVar13._6_2_ = uVar59;
                  auVar13._8_2_ = uVar59;
                  auVar13._10_2_ = uVar59;
                  auVar13._12_2_ = uVar59;
                  auVar13._14_2_ = uVar59;
                  auVar13._16_2_ = uVar59;
                  auVar13._18_2_ = uVar59;
                  auVar13._20_2_ = uVar59;
                  auVar13._22_2_ = uVar59;
                  auVar13._24_2_ = uVar59;
                  auVar13._26_2_ = uVar59;
                  auVar13._28_2_ = uVar59;
                  auVar13._30_2_ = uVar59;
                  auVar70 = vpsubsw_avx2(auVar13,(undefined1  [32])*ptr_04);
                  auVar84 = ZEXT1664((undefined1  [16])0x0);
                  lVar47 = 0;
                  auVar83 = ZEXT1664((undefined1  [16])0x0);
                  auVar65 = ZEXT1664((undefined1  [16])0x0);
                  do {
                    auVar75 = vpaddsw_avx2(auVar15,*(undefined1 (*) [32])
                                                    ((long)pvVar6 + lVar47 + lVar53));
                    auVar64 = vpaddsw_avx2(auVar62,*(undefined1 (*) [32])
                                                    ((long)pvVar8 + lVar47 + lVar53));
                    auVar15 = *(undefined1 (*) [32])((long)*ptr + lVar47);
                    auVar62 = *(undefined1 (*) [32])((long)*b_03 + lVar47);
                    auVar71 = vpaddsw_avx2(auVar82,*(undefined1 (*) [32])
                                                    ((long)pvVar9 + lVar47 + lVar53));
                    auVar82 = *(undefined1 (*) [32])((long)*b_04 + lVar47);
                    auVar70 = vpaddsw_avx2(auVar70,*(undefined1 (*) [32])((long)*ptr_04 + lVar47));
                    auVar27._8_2_ = 1;
                    auVar27._0_8_ = 0x1000100010001;
                    auVar27._10_2_ = 1;
                    auVar27._12_2_ = 1;
                    auVar27._14_2_ = 1;
                    auVar27._16_2_ = 1;
                    auVar27._18_2_ = 1;
                    auVar27._20_2_ = 1;
                    auVar27._22_2_ = 1;
                    auVar27._24_2_ = 1;
                    auVar27._26_2_ = 1;
                    auVar27._28_2_ = 1;
                    auVar27._30_2_ = 1;
                    auVar76 = vpaddsw_avx2(auVar14,auVar27);
                    auVar14 = *(undefined1 (*) [32])((long)*b_05 + lVar47);
                    auVar85 = vpcmpgtw_avx2(auVar70,auVar13);
                    auVar89 = vpblendvb_avx2(auVar65._0_32_,local_198,auVar85);
                    auVar86 = vpblendvb_avx2(auVar83._0_32_,local_178,auVar85);
                    auVar80 = vpaddsw_avx2(local_158,*(undefined1 (*) [32])((long)*ptr_05 + lVar47))
                    ;
                    auVar85 = vpblendvb_avx2(auVar84._0_32_,auVar80,auVar85);
                    auVar25._2_2_ = uVar57;
                    auVar25._0_2_ = uVar57;
                    auVar25._4_2_ = uVar57;
                    auVar25._6_2_ = uVar57;
                    auVar25._8_2_ = uVar57;
                    auVar25._10_2_ = uVar57;
                    auVar25._12_2_ = uVar57;
                    auVar25._14_2_ = uVar57;
                    auVar25._16_2_ = uVar57;
                    auVar25._18_2_ = uVar57;
                    auVar25._20_2_ = uVar57;
                    auVar25._22_2_ = uVar57;
                    auVar25._24_2_ = uVar57;
                    auVar25._26_2_ = uVar57;
                    auVar25._28_2_ = uVar57;
                    auVar25._30_2_ = uVar57;
                    auVar81 = vpsubsw_avx2(auVar15,auVar25);
                    auVar12._2_2_ = uVar58;
                    auVar12._0_2_ = uVar58;
                    auVar12._4_2_ = uVar58;
                    auVar12._6_2_ = uVar58;
                    auVar12._8_2_ = uVar58;
                    auVar12._10_2_ = uVar58;
                    auVar12._12_2_ = uVar58;
                    auVar12._14_2_ = uVar58;
                    auVar12._16_2_ = uVar58;
                    auVar12._18_2_ = uVar58;
                    auVar12._20_2_ = uVar58;
                    auVar12._22_2_ = uVar58;
                    auVar12._24_2_ = uVar58;
                    auVar12._26_2_ = uVar58;
                    auVar12._28_2_ = uVar58;
                    auVar12._30_2_ = uVar58;
                    auVar88 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar47),auVar12);
                    auVar80 = vpcmpgtw_avx2(auVar81,auVar88);
                    auVar12 = vpmaxsw_avx2(auVar81,auVar88);
                    auVar81 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar47),auVar62,
                                             auVar80);
                    auVar88 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar47),auVar82,
                                             auVar80);
                    auVar80 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar47),auVar14,
                                             auVar80);
                    auVar80 = vpaddsw_avx2(auVar27,auVar80);
                    auVar11 = vpcmpgtw_avx2(auVar12,auVar75);
                    *(undefined1 (*) [32])((long)*b + lVar47) = auVar12;
                    *(undefined1 (*) [32])((long)*b_00 + lVar47) = auVar81;
                    local_198 = vpblendvb_avx2(auVar64,auVar81,auVar11);
                    *(undefined1 (*) [32])((long)*b_01 + lVar47) = auVar88;
                    local_178 = vpblendvb_avx2(auVar71,auVar88,auVar11);
                    local_158 = vpblendvb_avx2(auVar76,auVar80,auVar11);
                    auVar65 = ZEXT3264(auVar89);
                    *(undefined1 (*) [32])((long)*b_02 + lVar47) = auVar80;
                    auVar84 = ZEXT3264(auVar85);
                    auVar13 = vpmaxsw_avx2(auVar13,auVar70);
                    auVar70 = vpmaxsw_avx2(auVar12,auVar75);
                    auVar83 = ZEXT3264(auVar86);
                    *(undefined1 (*) [32])((long)*ptr + lVar47) = auVar75;
                    *(undefined1 (*) [32])((long)*b_03 + lVar47) = auVar64;
                    *(undefined1 (*) [32])((long)*b_04 + lVar47) = auVar71;
                    *(undefined1 (*) [32])((long)*b_05 + lVar47) = auVar76;
                    lVar47 = lVar47 + 0x20;
                  } while (size << 5 != lVar47);
                  auVar15 = vperm2i128_avx2(local_198,local_198,0x28);
                  local_198 = vpalignr_avx2(local_198,auVar15,0xe);
                  auVar15 = vperm2i128_avx2(local_178,local_178,0x28);
                  local_178 = vpalignr_avx2(local_178,auVar15,0xe);
                  auVar82 = vperm2i128_avx2(local_158,local_158,0x28);
                  auVar77._0_16_ = ZEXT116(0) * auVar70._0_16_ + ZEXT116(1) * local_158._0_16_;
                  auVar77._16_16_ = ZEXT116(0) * local_158._16_16_ + ZEXT116(1) * auVar70._0_16_;
                  auVar15 = vpalignr_avx2(auVar70,auVar77,0xe);
                  auVar68 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar39 + 1],0);
                  local_158 = vpalignr_avx2(local_158,auVar82,0xe);
                  auVar75 = vpblendd_avx2(auVar15,ZEXT1632(auVar68),0xf);
                  auVar15 = vpaddsw_avx2(auVar75,(undefined1  [32])*ptr_04);
                  auVar62 = vpcmpgtw_avx2(auVar13,auVar15);
                  auVar70 = vpmaxsw_avx2(auVar13,auVar15);
                  auVar82 = vpblendvb_avx2(local_198,auVar89,auVar62);
                  auVar14 = vpblendvb_avx2(local_178,auVar86,auVar62);
                  auVar15 = vpaddsw_avx2(local_158,(undefined1  [32])*ptr_05);
                  uVar39 = uVar39 + 1;
                  auVar15 = vpblendvb_avx2(auVar15,auVar85,auVar62);
                  iVar32 = 0xe;
                  do {
                    auVar71 = vperm2i128_avx2(auVar15,auVar15,0x28);
                    auVar76 = vperm2i128_avx2(auVar14,auVar14,0x28);
                    auVar80 = vperm2i128_avx2(auVar82,auVar82,0x28);
                    auVar62 = vperm2i128_avx2(auVar70,auVar70,0x28);
                    auVar62 = vpalignr_avx2(auVar70,auVar62,0xe);
                    auVar62 = vpaddsw_avx2(auVar62,auVar61);
                    auVar64 = vpcmpgtw_avx2(auVar70,auVar62);
                    auVar70 = vpmaxsw_avx2(auVar70,auVar62);
                    auVar62 = vpalignr_avx2(auVar82,auVar80,0xe);
                    auVar82 = vpblendvb_avx2(auVar62,auVar82,auVar64);
                    auVar62 = vpalignr_avx2(auVar14,auVar76,0xe);
                    auVar14 = vpblendvb_avx2(auVar62,auVar14,auVar64);
                    auVar62 = vpalignr_avx2(auVar15,auVar71,0xe);
                    auVar62 = vpaddsw_avx2(auVar62,auVar69);
                    auVar15 = vpblendvb_avx2(auVar62,auVar15,auVar64);
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                  auVar62 = vperm2i128_avx2(auVar70,auVar70,0x28);
                  auVar71 = vperm2i128_avx2(auVar82,auVar82,0x28);
                  auVar76 = vperm2i128_avx2(auVar14,auVar14,0x28);
                  auVar80 = vperm2i128_avx2(auVar15,auVar15,0x28);
                  auVar62 = vpalignr_avx2(auVar70,auVar62,0xe);
                  auVar62 = vpaddsw_avx2(auVar62,auVar63);
                  auVar64 = vpcmpgtw_avx2(auVar62,auVar75);
                  auVar82 = vpalignr_avx2(auVar82,auVar71,0xe);
                  auVar70 = vpblendvb_avx2(local_198,auVar82,auVar64);
                  auVar71 = vpmaxsw_avx2(auVar75,auVar62);
                  auVar14 = vpalignr_avx2(auVar14,auVar76,0xe);
                  auVar75 = vpblendvb_avx2(local_178,auVar14,auVar64);
                  auVar15 = vpalignr_avx2(auVar15,auVar80,0xe);
                  auVar64 = vpblendvb_avx2(local_158,auVar15,auVar64);
                  lVar53 = 0;
                  auVar65 = ZEXT3264(local_1d8);
                  lVar47 = local_330;
                  do {
                    auVar4._8_2_ = 1;
                    auVar4._0_8_ = 0x1000100010001;
                    auVar4._10_2_ = 1;
                    auVar4._12_2_ = 1;
                    auVar4._14_2_ = 1;
                    auVar4._16_2_ = 1;
                    auVar4._18_2_ = 1;
                    auVar4._20_2_ = 1;
                    auVar4._22_2_ = 1;
                    auVar4._24_2_ = 1;
                    auVar4._26_2_ = 1;
                    auVar4._28_2_ = 1;
                    auVar4._30_2_ = 1;
                    auVar76 = *(undefined1 (*) [32])((long)*ptr + lVar53);
                    auVar26._2_2_ = uVar57;
                    auVar26._0_2_ = uVar57;
                    auVar26._4_2_ = uVar57;
                    auVar26._6_2_ = uVar57;
                    auVar26._8_2_ = uVar57;
                    auVar26._10_2_ = uVar57;
                    auVar26._12_2_ = uVar57;
                    auVar26._14_2_ = uVar57;
                    auVar26._16_2_ = uVar57;
                    auVar26._18_2_ = uVar57;
                    auVar26._20_2_ = uVar57;
                    auVar26._22_2_ = uVar57;
                    auVar26._24_2_ = uVar57;
                    auVar26._26_2_ = uVar57;
                    auVar26._28_2_ = uVar57;
                    auVar26._30_2_ = uVar57;
                    auVar71 = vpsubsw_avx2(auVar71,auVar26);
                    auVar24._2_2_ = uVar58;
                    auVar24._0_2_ = uVar58;
                    auVar24._4_2_ = uVar58;
                    auVar24._6_2_ = uVar58;
                    auVar24._8_2_ = uVar58;
                    auVar24._10_2_ = uVar58;
                    auVar24._12_2_ = uVar58;
                    auVar24._14_2_ = uVar58;
                    auVar24._16_2_ = uVar58;
                    auVar24._18_2_ = uVar58;
                    auVar24._20_2_ = uVar58;
                    auVar24._22_2_ = uVar58;
                    auVar24._24_2_ = uVar58;
                    auVar24._26_2_ = uVar58;
                    auVar24._28_2_ = uVar58;
                    auVar24._30_2_ = uVar58;
                    auVar80 = vpsubsw_avx2(auVar62,auVar24);
                    auVar62 = vpmaxsw_avx2(auVar71,auVar80);
                    auVar71 = vpcmpgtw_avx2(auVar71,auVar80);
                    auVar82 = vpblendvb_avx2(auVar82,auVar70,auVar71);
                    auVar15 = vpblendvb_avx2(auVar15,auVar64,auVar71);
                    auVar80 = vpmaxsw_avx2(auVar76,*(undefined1 (*) [32])((long)*b + lVar53));
                    auVar14 = vpblendvb_avx2(auVar14,auVar75,auVar71);
                    auVar64 = vpcmpgtw_avx2(auVar80,auVar62);
                    auVar70 = vpblendvb_avx2(auVar82,*(undefined1 (*) [32])((long)*b_00 + lVar53),
                                             auVar64);
                    auVar15 = vpaddsw_avx2(auVar4,auVar15);
                    auVar75 = vpblendvb_avx2(auVar14,*(undefined1 (*) [32])((long)*b_01 + lVar53),
                                             auVar64);
                    auVar71 = vpmaxsw_avx2(auVar80,auVar62);
                    auVar64 = vpblendvb_avx2(auVar15,*(undefined1 (*) [32])((long)*b_02 + lVar53),
                                             auVar64);
                    auVar76 = vpcmpeqw_avx2(auVar71,auVar76);
                    auVar70 = vpblendvb_avx2(auVar70,*(undefined1 (*) [32])((long)*b_03 + lVar53),
                                             auVar76);
                    auVar75 = vpblendvb_avx2(auVar75,*(undefined1 (*) [32])((long)*b_04 + lVar53),
                                             auVar76);
                    auVar64 = vpblendvb_avx2(auVar64,*(undefined1 (*) [32])((long)*b_05 + lVar53),
                                             auVar76);
                    *(undefined1 (*) [32])((long)*ptr + lVar53) = auVar71;
                    *(undefined1 (*) [32])((long)*b_03 + lVar53) = auVar70;
                    *(undefined1 (*) [32])((long)*b_04 + lVar53) = auVar75;
                    *(undefined1 (*) [32])((long)*b_05 + lVar53) = auVar64;
                    lVar36 = *((ppVar33->field_4).trace)->trace_del_table;
                    auVar68 = auVar71._0_16_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar36 + lVar47) = (int)auVar71._0_2_;
                    uVar51 = vpextrw_avx(auVar68,2);
                    lVar36 = lVar36 + lVar47;
                    *(int *)(lVar38 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar1 + lVar36) = (int)(short)uVar51;
                    uVar51 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar17 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar55 + lVar36) = (int)(short)uVar51;
                    uVar51 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar18 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar19 + lVar36) = (int)(short)uVar51;
                    auVar68 = auVar71._16_16_;
                    *(int *)(lVar22 + lVar36) = (int)(short)uVar50;
                    uVar51 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar35 + lVar36) = (int)auVar71._16_2_;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar20 + lVar36) = (int)(short)uVar51;
                    uVar51 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar21 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar40 + lVar36) = (int)(short)uVar51;
                    uVar51 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar54 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar41 + lVar36) = (int)(short)uVar51;
                    uVar51 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar42 + lVar36) = (int)(short)uVar50;
                    *(int *)(lVar43 + lVar36) = (int)(short)uVar51;
                    lVar36 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar36 + lVar47) = (int)auVar70._0_2_;
                    auVar68 = auVar70._0_16_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    lVar36 = lVar36 + lVar47;
                    *(int *)(lVar38 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar1 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar17 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar55 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar18 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar19 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar22 + lVar36) = (int)(short)uVar50;
                    auVar68 = auVar70._16_16_;
                    *(int *)(lVar35 + lVar36) = (int)auVar70._16_2_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar20 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar21 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar40 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar54 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar41 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar42 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar43 + lVar36) = (int)(short)uVar50;
                    lVar36 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar36 + lVar47) = (int)auVar75._0_2_;
                    auVar68 = auVar75._0_16_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    lVar36 = lVar36 + lVar47;
                    *(int *)(lVar38 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar1 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar17 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar55 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar18 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar19 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar22 + lVar36) = (int)(short)uVar50;
                    auVar68 = auVar75._16_16_;
                    *(int *)(lVar35 + lVar36) = (int)auVar75._16_2_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar20 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar21 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar40 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar54 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar41 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar42 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar43 + lVar36) = (int)(short)uVar50;
                    lVar36 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar36 + lVar47) = (int)auVar64._0_2_;
                    lVar36 = lVar36 + lVar47;
                    auVar68 = auVar64._0_16_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar38 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar1 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar17 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar55 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar18 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar19 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar22 + lVar36) = (int)(short)uVar50;
                    auVar68 = auVar64._16_16_;
                    *(int *)(lVar35 + lVar36) = (int)auVar64._16_2_;
                    uVar50 = vpextrw_avx(auVar68,1);
                    *(int *)(lVar20 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,2);
                    *(int *)(lVar21 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,3);
                    *(int *)(lVar40 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,4);
                    *(int *)(lVar54 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,5);
                    *(int *)(lVar41 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,6);
                    *(int *)(lVar42 + lVar36) = (int)(short)uVar50;
                    uVar50 = vpextrw_avx(auVar68,7);
                    *(int *)(lVar43 + lVar36) = (int)(short)uVar50;
                    local_1b8 = vpminsw_avx2(auVar71,local_1b8);
                    auVar76 = vpmaxsw_avx2(auVar71,auVar65._0_32_);
                    auVar76 = vpmaxsw_avx2(auVar70,auVar76);
                    auVar80 = vpmaxsw_avx2(auVar75,auVar64);
                    local_1d8 = vpmaxsw_avx2(auVar76,auVar80);
                    auVar65 = ZEXT3264(local_1d8);
                    lVar53 = lVar53 + 0x20;
                    lVar47 = lVar47 + uVar52 * 4;
                  } while (size << 5 != lVar53);
                  local_330 = local_330 + 4;
                } while (uVar39 != uVar52);
                alVar16 = ptr[uVar10];
                auVar68 = alVar16._16_16_;
                alVar2 = b_03[uVar10];
                auVar72 = alVar2._16_16_;
                alVar3 = b_04[uVar10];
                auVar60 = alVar3._16_16_;
                alVar5 = b_05[uVar10];
                auVar66 = alVar5._16_16_;
                if (iVar48 < 0xf) {
                  iVar32 = 0;
                  do {
                    auVar61 = vperm2i128_avx2((undefined1  [32])alVar16,(undefined1  [32])alVar16,
                                              0x28);
                    alVar16 = (__m256i)vpalignr_avx2((undefined1  [32])alVar16,auVar61,0xe);
                    auVar68 = alVar16._16_16_;
                    auVar61 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar61,0xe);
                    auVar72 = alVar2._16_16_;
                    auVar61 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28
                                             );
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar61,0xe);
                    auVar60 = alVar3._16_16_;
                    auVar61 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28
                                             );
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar61,0xe);
                    auVar66 = alVar5._16_16_;
                    iVar32 = iVar32 + 1;
                  } while (iVar32 < 0xf - iVar48);
                }
                auVar23._2_2_ = uVar59;
                auVar23._0_2_ = uVar59;
                auVar23._4_2_ = uVar59;
                auVar23._6_2_ = uVar59;
                auVar23._8_2_ = uVar59;
                auVar23._10_2_ = uVar59;
                auVar23._12_2_ = uVar59;
                auVar23._14_2_ = uVar59;
                auVar23._16_2_ = uVar59;
                auVar23._18_2_ = uVar59;
                auVar23._20_2_ = uVar59;
                auVar23._22_2_ = uVar59;
                auVar23._24_2_ = uVar59;
                auVar23._26_2_ = uVar59;
                auVar23._28_2_ = uVar59;
                auVar23._30_2_ = uVar59;
                auVar61 = vpcmpgtw_avx2(auVar23,local_1b8);
                auVar28._2_2_ = sVar29;
                auVar28._0_2_ = sVar29;
                auVar28._4_2_ = sVar29;
                auVar28._6_2_ = sVar29;
                auVar28._8_2_ = sVar29;
                auVar28._10_2_ = sVar29;
                auVar28._12_2_ = sVar29;
                auVar28._14_2_ = sVar29;
                auVar28._16_2_ = sVar29;
                auVar28._18_2_ = sVar29;
                auVar28._20_2_ = sVar29;
                auVar28._22_2_ = sVar29;
                auVar28._24_2_ = sVar29;
                auVar28._26_2_ = sVar29;
                auVar28._28_2_ = sVar29;
                auVar28._30_2_ = sVar29;
                auVar69 = vpcmpgtw_avx2(local_1d8,auVar28);
                auVar61 = vpor_avx2(auVar69,auVar61);
                if ((((((((((((((((((((((((((((((((auVar61 >> 7 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar61 >> 0xf & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar61 >> 0x17 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar61 >> 0x1f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar61 >> 0x27 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar61 >> 0x2f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar61 >> 0x37 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar61 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar61 >> 0x47 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar61 >> 0x4f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar61 >> 0x57 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar61 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar61 >> 0x67 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar61 >> 0x6f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar61 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar61 >> 0x7f,0) == '\0') &&
                                  (auVar61 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar61 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar61 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar61 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar61 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar61 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar61 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar61 >> 0xbf,0) == '\0') &&
                          (auVar61 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar61 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar61 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar61 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar61 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar61 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar61 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    -1 < auVar61[0x1f]) {
                  uVar50 = vpextrw_avx(auVar68,7);
                  sVar30 = (short)uVar50;
                  uVar50 = vpextrw_avx(auVar72,7);
                  sVar37 = (short)uVar50;
                  uVar50 = vpextrw_avx(auVar60,7);
                  sVar29 = (short)uVar50;
                  uVar50 = vpextrw_avx(auVar66,7);
                  sVar49 = (short)uVar50;
                }
                else {
                  *(byte *)&ppVar33->flag = (byte)ppVar33->flag | 0x40;
                  sVar30 = 0;
                  sVar37 = 0;
                  sVar29 = 0;
                  sVar49 = 0;
                  iVar31 = 0;
                  uVar56 = 0;
                }
                ppVar33->score = (int)sVar30;
                ppVar33->end_query = uVar56;
                ppVar33->end_ref = iVar31;
                *(int *)(ppVar33->field_4).extra = (int)sVar37;
                ((ppVar33->field_4).stats)->similar = (int)sVar29;
                ((ppVar33->field_4).stats)->length = (int)sVar49;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar33;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}